

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O3

bool __thiscall
sf::Shader::loadFromFile(Shader *this,string *vertexShaderFilename,string *fragmentShaderFilename)

{
  bool bVar1;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> fragmentShader;
  vector<char,_std::allocator<char>_> vertexShader;
  vector<char,_std::allocator<char>_> local_58;
  vector<char,_std::allocator<char>_> local_38;
  
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = anon_unknown.dwarf_35cd64::getFileContents
                    ((string *)(vertexShaderFilename->_M_dataplus)._M_p,&local_38);
  if (bVar1) {
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (char *)0x0;
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar1 = anon_unknown.dwarf_35cd64::getFileContents
                      ((string *)(fragmentShaderFilename->_M_dataplus)._M_p,&local_58);
    if (bVar1) {
      bVar1 = compile(this,local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,(char *)0x0,
                      local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    else {
      poVar2 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"Failed to open fragment shader file \"",0x25);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(fragmentShaderFilename->_M_dataplus)._M_p,
                          fragmentShaderFilename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      bVar1 = false;
    }
    if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    poVar2 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Failed to open vertex shader file \"",0x23);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(vertexShaderFilename->_M_dataplus)._M_p,
                        vertexShaderFilename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar1 = false;
  }
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool Shader::loadFromFile(const std::string& vertexShaderFilename, const std::string& fragmentShaderFilename)
{
    // Read the vertex shader file
    std::vector<char> vertexShader;
    if (!getFileContents(vertexShaderFilename, vertexShader))
    {
        err() << "Failed to open vertex shader file \"" << vertexShaderFilename << "\"" << std::endl;
        return false;
    }

    // Read the fragment shader file
    std::vector<char> fragmentShader;
    if (!getFileContents(fragmentShaderFilename, fragmentShader))
    {
        err() << "Failed to open fragment shader file \"" << fragmentShaderFilename << "\"" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], NULL, &fragmentShader[0]);
}